

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpmultipart.cpp
# Opt level: O3

bool __thiscall QHttpMultiPartIODevice::isSequential(QHttpMultiPartIODevice *this)

{
  QIODevice *pQVar1;
  char cVar2;
  QHttpMultiPartPrivate *pQVar3;
  ulong uVar4;
  
  pQVar3 = this->multiPart;
  if ((pQVar3->parts).d.size != 0) {
    uVar4 = 0;
    do {
      pQVar1 = ((pQVar3->parts).d.ptr[uVar4].d.d.ptr)->bodyDevice;
      if (pQVar1 != (QIODevice *)0x0) {
        cVar2 = (**(code **)(*(long *)pQVar1 + 0x60))();
        if (cVar2 != '\0') {
          return true;
        }
        pQVar3 = this->multiPart;
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 < (ulong)(pQVar3->parts).d.size);
  }
  return false;
}

Assistant:

bool QHttpMultiPartIODevice::isSequential() const
{
    for (int a = 0; a < multiPart->parts.size(); a++) {
        QIODevice *device = multiPart->parts.at(a).d->bodyDevice;
        // we are sequential if any of the bodyDevices of our parts are sequential;
        // when reading from a byte array, we are not sequential
        if (device && device->isSequential())
            return true;
    }
    return false;
}